

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_struct_layout(CPState *cp,CTypeID sid,CTInfo sattr)

{
  ushort uVar1;
  CTInfo info_00;
  uint uVar2;
  uint local_a0;
  uint local_9c;
  uint local_98;
  CTSize csz;
  CTSize bsz;
  CTInfo info;
  CTSize sz;
  CTSize amask;
  CTSize align;
  CTInfo attr;
  CType *ct;
  CTypeID fieldid;
  CTInfo sinfo;
  CType *sct;
  uint local_60;
  CTSize maxalign;
  CTSize bmaxofs;
  CTSize bofs;
  CTInfo sattr_local;
  CTypeID sid_local;
  CPState *cp_local;
  CTState *local_40;
  CTypeID local_34;
  CTState *local_30;
  CTypeID local_24;
  CTState *local_20;
  uint local_14;
  CTState *local_10;
  
  maxalign = 0;
  local_60 = 0;
  sct._4_4_ = sattr >> 0x10 & 0xf;
  local_30 = cp->cts;
  _fieldid = local_30->tab + sid;
  ct._4_4_ = _fieldid->info;
  uVar1 = _fieldid->sib;
  bmaxofs = sattr;
  bofs = sid;
  _sattr_local = cp;
  local_34 = sid;
  local_24 = sid;
  local_20 = local_30;
  do {
    ct._0_4_ = (uint)uVar1;
    if ((uint)ct == 0) {
      _fieldid->info = ct._4_4_ + sct._4_4_ * 0x10000;
      if ((ct._4_4_ & 0x800000) == 0) {
        local_a0 = maxalign;
      }
      else {
        local_a0 = local_60;
      }
      uVar2 = (8 << ((byte)sct._4_4_ & 0x1f)) - 1;
      _fieldid->size = (local_a0 + uVar2 & (uVar2 ^ 0xffffffff)) >> 3;
      return;
    }
    local_40 = _sattr_local->cts;
    cp_local._4_4_ = (uint)ct;
    local_14 = (uint)ct;
    _align = local_40->tab + (uint)ct;
    amask = _align->size;
    if ((_align->info >> 0x1c == 9) || (((_align->info & 0xf0ff0000) == 0x80030000 && (amask != 0)))
       ) {
      local_10 = local_40;
      info_00 = lj_ctype_info(_sattr_local->cts,_align->info & 0xffff,&bsz);
      local_9c = bsz * 8;
      uVar2 = info_00 & 0x3100000 | ct._4_4_;
      if ((0x1fffffff < bsz) || ((maxalign + local_9c < maxalign || ((info_00 & 0x100000) != 0)))) {
        if ((bsz != 0xffffffff) || ((info_00 >> 0x1c != 3 || ((ct._4_4_ & 0x800000) != 0)))) {
          ct._4_4_ = uVar2;
          cp_err(_sattr_local,LJ_ERR_FFI_INVSIZE);
        }
        bsz = 0;
        local_9c = 0;
      }
      ct._4_4_ = uVar2;
      sz = cp_field_align(_sattr_local,_align,info_00);
      if ((((amask | bmaxofs) & 2) != 0) || (((amask & 1) != 0 && (sz < (amask >> 0x10 & 0xf))))) {
        sz = amask >> 0x10 & 0xf;
      }
      if (_sattr_local->packstack[_sattr_local->curpack] < sz) {
        sz = (CTSize)_sattr_local->packstack[_sattr_local->curpack];
      }
      if (sct._4_4_ < sz) {
        sct._4_4_ = sz;
      }
      info = (8 << ((byte)sz & 0x1f)) - 1;
      local_98 = _align->info >> 0x10 & 0x7f;
      if ((local_98 == 0x7f) || (_align->info >> 0x1c != 9)) {
        local_98 = local_9c;
        maxalign = maxalign + info & (info ^ 0xffffffff);
        _align->size = maxalign >> 3;
      }
      else {
        if (((local_98 == 0) || ((amask & 1) != 0)) ||
           ((((amask | bmaxofs) & 2) == 0 && (local_9c < (maxalign & info) + local_98)))) {
          maxalign = maxalign + info & (info ^ 0xffffffff);
        }
        if ((local_98 == local_9c) && ((maxalign & info) == 0)) {
          _align->info = (_align->info & 0xffff) + 0x90000000;
          _align->size = maxalign >> 3;
        }
        else {
          _align->info = (info_00 & 0xb800000) + local_9c * 0x2000 + local_98 * 0x100 + 0xa0000000;
          _align->info = (maxalign & local_9c - 1) + _align->info;
          _align->size = (maxalign & (local_9c - 1 ^ 0xffffffff)) >> 3;
        }
      }
      if ((ct._4_4_ & 0x800000) == 0) {
        maxalign = local_98 + maxalign;
      }
      else if (local_60 < local_98) {
        local_60 = local_98;
      }
    }
    uVar1 = _align->sib;
  } while( true );
}

Assistant:

static void cp_struct_layout(CPState *cp, CTypeID sid, CTInfo sattr)
{
  CTSize bofs = 0, bmaxofs = 0;  /* Bit offset and max. bit offset. */
  CTSize maxalign = ctype_align(sattr);
  CType *sct = ctype_get(cp->cts, sid);
  CTInfo sinfo = sct->info;
  CTypeID fieldid = sct->sib;
  while (fieldid) {
    CType *ct = ctype_get(cp->cts, fieldid);
    CTInfo attr = ct->size;  /* Field declaration attributes (temp.). */

    if (ctype_isfield(ct->info) ||
	(ctype_isxattrib(ct->info, CTA_SUBTYPE) && attr)) {
      CTSize align, amask;  /* Alignment (pow2) and alignment mask (bits). */
      CTSize sz;
      CTInfo info = lj_ctype_info(cp->cts, ctype_cid(ct->info), &sz);
      CTSize bsz, csz = 8*sz;  /* Field size and container size (in bits). */
      sinfo |= (info & (CTF_QUAL|CTF_VLA));  /* Merge pseudo-qualifiers. */

      /* Check for size overflow and determine alignment. */
      if (sz >= 0x20000000u || bofs + csz < bofs || (info & CTF_VLA)) {
	if (!(sz == CTSIZE_INVALID && ctype_isarray(info) &&
	      !(sinfo & CTF_UNION)))
	  cp_err(cp, LJ_ERR_FFI_INVSIZE);
	csz = sz = 0;  /* Treat a[] and a[?] as zero-sized. */
      }
      align = cp_field_align(cp, ct, info);
      if (((attr|sattr) & CTFP_PACKED) ||
	  ((attr & CTFP_ALIGNED) && ctype_align(attr) > align))
	align = ctype_align(attr);
      if (cp->packstack[cp->curpack] < align)
	align = cp->packstack[cp->curpack];
      if (align > maxalign) maxalign = align;
      amask = (8u << align) - 1;

      bsz = ctype_bitcsz(ct->info);  /* Bitfield size (temp.). */
      if (bsz == CTBSZ_FIELD || !ctype_isfield(ct->info)) {
	bsz = csz;  /* Regular fields or subtypes always fill the container. */
	bofs = (bofs + amask) & ~amask;  /* Start new aligned field. */
	ct->size = (bofs >> 3);  /* Store field offset. */
      } else {  /* Bitfield. */
	if (bsz == 0 || (attr & CTFP_ALIGNED) ||
	    (!((attr|sattr) & CTFP_PACKED) && (bofs & amask) + bsz > csz))
	  bofs = (bofs + amask) & ~amask;  /* Start new aligned field. */

	/* Prefer regular field over bitfield. */
	if (bsz == csz && (bofs & amask) == 0) {
	  ct->info = CTINFO(CT_FIELD, ctype_cid(ct->info));
	  ct->size = (bofs >> 3);  /* Store field offset. */
	} else {
	  ct->info = CTINFO(CT_BITFIELD,
	    (info & (CTF_QUAL|CTF_UNSIGNED|CTF_BOOL)) +
	    (csz << (CTSHIFT_BITCSZ-3)) + (bsz << CTSHIFT_BITBSZ));
#if LJ_BE
	  ct->info += ((csz - (bofs & (csz-1)) - bsz) << CTSHIFT_BITPOS);
#else
	  ct->info += ((bofs & (csz-1)) << CTSHIFT_BITPOS);
#endif
	  ct->size = ((bofs & ~(csz-1)) >> 3);  /* Store container offset. */
	}
      }

      /* Determine next offset or max. offset. */
      if ((sinfo & CTF_UNION)) {
	if (bsz > bmaxofs) bmaxofs = bsz;
      } else {
	bofs += bsz;
      }
    }  /* All other fields in the chain are already set up. */

    fieldid = ct->sib;
  }

  /* Complete struct/union. */
  sct->info = sinfo + CTALIGN(maxalign);
  bofs = (sinfo & CTF_UNION) ? bmaxofs : bofs;
  maxalign = (8u << maxalign) - 1;
  sct->size = (((bofs + maxalign) & ~maxalign) >> 3);
}